

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

sc_signed * sc_dt::operator/(sc_signed *__return_storage_ptr__,sc_unsigned *u,sc_signed *v)

{
  int iVar1;
  sc_length_param *psVar2;
  
  iVar1 = v->sgn;
  if (u->sgn == 0 || iVar1 == 0) {
    if (iVar1 == 0) {
      sc_core::sc_report_handler::report
                (SC_ERROR,"operation failed","div_by_zero<Type>( Type ) : division by zero",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/int/sc_nbutils.h"
                 ,0x2a8);
      sc_core::sc_abort();
    }
    psVar2 = sc_context<sc_dt::sc_length_param>::default_value();
    sc_signed::sc_signed(__return_storage_ptr__,psVar2->m_len);
  }
  else {
    div_signed_friend(__return_storage_ptr__,(uint)(u->sgn == iVar1) * 2 + -1,u->nbits,u->ndigits,
                      u->digit,v->nbits,v->ndigits,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator/(const sc_unsigned& u, const sc_signed& v)
{

  small_type s = mul_signs(u.sgn, v.sgn);

  if (s == SC_ZERO) {
    div_by_zero(v.sgn); // case 1
    return sc_signed();  // case 2
  }

  // other cases
  return div_signed_friend(s, u.nbits, u.ndigits, u.digit,
                           v.nbits, v.ndigits, v.digit);

}